

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O2

void glcts::CullDistance::Utilities::buildProgram
               (Functions *gl,TestContext *testCtx,GLchar *cs_body,GLchar *fs_body,GLchar *gs_body,
               GLchar *tc_body,GLchar *te_body,GLchar *vs_body,GLuint *n_tf_varyings,
               GLchar **tf_varyings,GLuint *out_program)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  GLuint GVar3;
  GLenum GVar4;
  GLuint GVar5;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  long lVar8;
  GLchar **ppGVar9;
  bool bVar10;
  allocator<char> local_291;
  GLint log_length;
  GLint compile_status;
  TestContext *local_288;
  vector<char,_std::allocator<char>_> log_array;
  string log_string;
  _shaders_configuration shaders_configuration [6];
  undefined1 local_1b0 [384];
  
  shaders_configuration[0].type = 0x91b9;
  shaders_configuration[0].id = 0;
  shaders_configuration[1].type = 0x8b30;
  shaders_configuration[1].id = 0;
  shaders_configuration[2].type = 0x8dd9;
  shaders_configuration[2].id = 0;
  shaders_configuration[3].type = 0x8e88;
  shaders_configuration[3].id = 0;
  shaders_configuration[4].type = 0x8e87;
  shaders_configuration[4].body = te_body;
  shaders_configuration[4].id = 0;
  shaders_configuration[5].type = 0x8b31;
  shaders_configuration[5].body = vs_body;
  shaders_configuration[5].id = 0;
  local_288 = testCtx;
  shaders_configuration[0].body = cs_body;
  shaders_configuration[1].body = fs_body;
  shaders_configuration[2].body = gs_body;
  shaders_configuration[3].body = tc_body;
  GVar3 = (*gl->createProgram)();
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glCreateProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                  ,0x5d);
  lVar8 = 6;
  ppGVar9 = &shaders_configuration[0].body;
  do {
    bVar10 = lVar8 == 0;
    lVar8 = lVar8 + -1;
    if (bVar10) {
      if (*n_tf_varyings != 0) {
        (*gl->transformFeedbackVaryings)(GVar3,*n_tf_varyings,tf_varyings,0x8c8c);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glTransformFeedbackVaryings() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x9c);
      }
      if (GVar3 != 0) {
        compile_status = 0;
        (*gl->linkProgram)(GVar3);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glLinkProgram() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xa5);
        (*gl->getProgramiv)(GVar3,0x8b82,&compile_status);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glGetProgramiv() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0xa8);
        if (compile_status == 0) {
          std::vector<char,_std::allocator<char>_>::vector(&log_array,1,(allocator_type *)local_1b0)
          ;
          log_length = 0;
          log_string._M_dataplus._M_p = (pointer)&log_string.field_2;
          log_string._M_string_length = 0;
          log_string.field_2._M_local_buf[0] = '\0';
          (*gl->getProgramiv)(GVar3,0x8b84,&log_length);
          GVar4 = (*gl->getError)();
          glu::checkError(GVar4,"glGetProgramiv() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                          ,0xb2);
          local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
          std::vector<char,_std::allocator<char>_>::resize
                    (&log_array,(long)(log_length + 1),local_1b0);
          (*gl->getProgramInfoLog)
                    (GVar3,log_length,(GLsizei *)0x0,
                     log_array.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
          GVar4 = (*gl->getError)();
          glu::checkError(GVar4,"glGetProgramInfoLog() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                          ,0xb8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1b0,
                     log_array.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_291);
          std::__cxx11::string::operator=((string *)&log_string,(string *)local_1b0);
          std::__cxx11::string::~string((string *)local_1b0);
          local_1b0._0_8_ = local_288->m_log;
          poVar2 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar2);
          std::operator<<((ostream *)poVar2,"Program linking has failed.\n");
          std::operator<<((ostream *)poVar2,"Linking error log:\n");
          std::operator<<((ostream *)poVar2,(string *)&log_string);
          std::operator<<((ostream *)poVar2,"\n");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar2);
          poVar2 = (ostringstream *)(local_1b0 + 8);
          lVar8 = 6;
          ppGVar9 = &shaders_configuration[0].body;
          while (bVar10 = lVar8 != 0, lVar8 = lVar8 + -1, bVar10) {
            if (*ppGVar9 != (GLchar *)0x0) {
              local_1b0._0_8_ = local_288->m_log;
              std::__cxx11::ostringstream::ostringstream(poVar2);
              std::operator<<((ostream *)poVar2,"Shader source code of type ");
              pMVar6 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)local_1b0,(uint *)(ppGVar9 + -1));
              std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              " follows:\n");
              pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,ppGVar9);
              std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                              "\n");
              tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(poVar2);
            }
            ppGVar9 = ppGVar9 + 3;
          }
          pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar7,"Program linking failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                     ,0xce);
          __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
      }
      for (lVar8 = 0x10; lVar8 != 0xa0; lVar8 = lVar8 + 0x18) {
        GVar5 = *(GLuint *)((long)&shaders_configuration[0].type + lVar8);
        if (GVar5 != 0) {
          (*gl->deleteShader)(GVar5);
          *(undefined4 *)((long)&shaders_configuration[0].type + lVar8) = 0;
          GVar4 = (*gl->getError)();
          glu::checkError(GVar4,"glDeleteShader() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                          ,0xdd);
        }
      }
      *out_program = GVar3;
      return;
    }
    if (*ppGVar9 != (GLchar *)0x0) {
      GVar5 = (*gl->createShader)(((_shaders_configuration *)(ppGVar9 + -1))->type);
      *(GLuint *)(ppGVar9 + 1) = GVar5;
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glCreateShader() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x65);
      compile_status = 0;
      GVar5 = *(GLuint *)(ppGVar9 + 1);
      (*gl->shaderSource)(GVar5,1,ppGVar9,(GLint *)0x0);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glShaderSource() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x6d);
      (*gl->compileShader)(GVar5);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x70);
      (*gl->getShaderiv)(GVar5,0x8b81,&compile_status);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x73);
      if (compile_status == 0) {
        std::vector<char,_std::allocator<char>_>::vector(&log_array,1,(allocator_type *)local_1b0);
        log_length = 0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&log_string,"Failed to retrieve log",(allocator<char> *)local_1b0);
        (*gl->getShaderiv)(GVar5,0x8b84,&log_length);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glGetShaderiv() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x7d);
        local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
        std::vector<char,_std::allocator<char>_>::resize
                  (&log_array,(long)(log_length + 1),local_1b0);
        (*gl->getShaderInfoLog)
                  (GVar5,log_length,(GLsizei *)0x0,
                   log_array.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
        GVar4 = (*gl->getError)();
        glu::checkError(GVar4,"glGetShaderInfoLog() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x82);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,
                   log_array.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,&local_291);
        std::__cxx11::string::operator=((string *)&log_string,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
        local_1b0._0_8_ = local_288->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"Shader compilation has failed.\n");
        std::operator<<((ostream *)poVar2,"Shader type: ");
        pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,(uint *)(ppGVar9 + -1))
        ;
        poVar1 = &pMVar6->m_str;
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        "Shader compilation error log:\n");
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        (string *)&log_string);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        "Shader source code:\n");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,ppGVar9);
        std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\n");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Shader compilation has failed.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                   ,0x8e);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (*gl->attachShader)(GVar3,GVar5);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glAttachShader() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x94);
    }
    ppGVar9 = ppGVar9 + 3;
  } while( true );
}

Assistant:

void CullDistance::Utilities::buildProgram(const glw::Functions& gl, tcu::TestContext& testCtx,
										   const glw::GLchar* cs_body, const glw::GLchar* fs_body,
										   const glw::GLchar* gs_body, const glw::GLchar* tc_body,
										   const glw::GLchar* te_body, const glw::GLchar* vs_body,
										   const glw::GLuint& n_tf_varyings, const glw::GLchar** tf_varyings,
										   glw::GLuint* out_program)
{
	glw::GLuint po_id = 0;

	struct _shaders_configuration
	{
		glw::GLenum		   type;
		const glw::GLchar* body;
		glw::GLuint		   id;
	} shaders_configuration[] = { { GL_COMPUTE_SHADER, cs_body, 0 },		 { GL_FRAGMENT_SHADER, fs_body, 0 },
								  { GL_GEOMETRY_SHADER, gs_body, 0 },		 { GL_TESS_CONTROL_SHADER, tc_body, 0 },
								  { GL_TESS_EVALUATION_SHADER, te_body, 0 }, { GL_VERTEX_SHADER, vs_body, 0 } };

	const glw::GLuint n_shaders_configuration = sizeof(shaders_configuration) / sizeof(shaders_configuration[0]);

	/* Guard allocated OpenGL resources */
	try
	{
		/* Create needed programs */
		po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

		for (glw::GLuint n_shader_index = 0; n_shader_index < n_shaders_configuration; n_shader_index++)
		{
			if (shaders_configuration[n_shader_index].body != DE_NULL)
			{
				/* Generate shader object */
				shaders_configuration[n_shader_index].id = gl.createShader(shaders_configuration[n_shader_index].type);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed");

				glw::GLint		  compile_status = GL_FALSE;
				const glw::GLuint so_id			 = shaders_configuration[n_shader_index].id;

				/* Assign shader source code */
				gl.shaderSource(shaders_configuration[n_shader_index].id, 1,		   /* count */
								&shaders_configuration[n_shader_index].body, DE_NULL); /* length */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

				gl.compileShader(so_id);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

				gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

				if (compile_status == GL_FALSE)
				{
					std::vector<glw::GLchar> log_array(1);
					glw::GLint				 log_length = 0;
					std::string				 log_string("Failed to retrieve log");

					/* Retrive compilation log length */
					gl.getShaderiv(so_id, GL_INFO_LOG_LENGTH, &log_length);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

					log_array.resize(log_length + 1, 0);

					gl.getShaderInfoLog(so_id, log_length, DE_NULL, &log_array[0]);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog() call failed.");

					log_string = std::string(&log_array[0]);

					testCtx.getLog() << tcu::TestLog::Message << "Shader compilation has failed.\n"
									 << "Shader type: " << shaders_configuration[n_shader_index].type << "\n"
									 << "Shader compilation error log:\n"
									 << log_string << "\n"
									 << "Shader source code:\n"
									 << shaders_configuration[n_shader_index].body << "\n"
									 << tcu::TestLog::EndMessage;

					TCU_FAIL("Shader compilation has failed.");
				}

				/* Also attach the shader to the corresponding program object */
				gl.attachShader(po_id, so_id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed");
			} /* if (shaders_configuration[n_shader_index].body != DE_NULL) */
		}	 /* for (all shader object IDs) */

		/* Set transform feedback if requested */
		if (n_tf_varyings > 0)
		{
			gl.transformFeedbackVaryings(po_id, n_tf_varyings, tf_varyings, GL_INTERLEAVED_ATTRIBS);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed");
		}

		/* Try to link the program objects */
		if (po_id != 0)
		{
			glw::GLint link_status = GL_FALSE;

			gl.linkProgram(po_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed");

			gl.getProgramiv(po_id, GL_LINK_STATUS, &link_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

			if (link_status == GL_FALSE)
			{
				std::vector<glw::GLchar> log_array(1);
				glw::GLsizei			 log_length = 0;
				std::string				 log_string;

				/* Retreive compilation log length */
				gl.getProgramiv(po_id, GL_INFO_LOG_LENGTH, &log_length);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

				log_array.resize(log_length + 1, 0);

				/* Retreive compilation log */
				gl.getProgramInfoLog(po_id, log_length, DE_NULL, &log_array[0]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog() call failed.");

				log_string = std::string(&log_array[0]);

				/* Log linking error message */
				testCtx.getLog() << tcu::TestLog::Message << "Program linking has failed.\n"
								 << "Linking error log:\n"
								 << log_string << "\n"
								 << tcu::TestLog::EndMessage;

				/* Log shader source code of shaders involved */
				for (glw::GLuint n_shader_index = 0; n_shader_index < n_shaders_configuration; n_shader_index++)
				{
					if (shaders_configuration[n_shader_index].body != DE_NULL)
					{
						testCtx.getLog() << tcu::TestLog::Message << "Shader source code of type "
										 << shaders_configuration[n_shader_index].type << " follows:\n"
										 << shaders_configuration[n_shader_index].body << "\n"
										 << tcu::TestLog::EndMessage;
					}
				}

				TCU_FAIL("Program linking failed");
			}
		} /* if (po_id != 0) */

		/* Delete all shaders we've created */
		for (glw::GLuint n_shader_index = 0; n_shader_index < n_shaders_configuration; n_shader_index++)
		{
			const glw::GLuint so_id = shaders_configuration[n_shader_index].id;

			if (so_id != 0)
			{
				gl.deleteShader(so_id);

				shaders_configuration[n_shader_index].id = 0;

				GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteShader() call failed.");
			}
		}

		/* Store the result progrtam IDs */
		*out_program = po_id;
	}
	catch (...)
	{
		/* Delete all shaders we've created */
		for (glw::GLuint n_shader_index = 0; n_shader_index < n_shaders_configuration; n_shader_index++)
		{
			const glw::GLuint so_id = shaders_configuration[n_shader_index].id;

			if (so_id != 0)
			{
				gl.deleteShader(so_id);

				shaders_configuration[n_shader_index].id = 0;
			}
		}

		/* Delete the program object */
		if (po_id != 0)
		{
			gl.deleteProgram(po_id);

			po_id = 0;
		}

		/* Rethrow */
		throw;
	}
}